

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderNavHighlight(ImRect *bb,ImGuiID id,ImGuiNavHighlightFlags flags)

{
  uint in_EDX;
  ImGuiID in_ESI;
  undefined8 *in_RDI;
  bool fully_visible;
  float DISTANCE;
  float THICKNESS;
  ImRect display_rect;
  float rounding;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff48;
  ImDrawList *in_stack_ffffffffffffff50;
  ImRect *in_stack_ffffffffffffff58;
  ImRect *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined1 intersect_with_current_clip_rect;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  float _x;
  ImVec2 *in_stack_ffffffffffffff78;
  ImDrawList *in_stack_ffffffffffffff80;
  float local_6c;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  byte local_45;
  ImVec2 local_44;
  undefined4 local_3c;
  undefined4 local_38;
  float thickness;
  ImVec2 IVar1;
  ImGuiWindow *p_max;
  ImGuiContext *p_min;
  
  intersect_with_current_clip_rect = (undefined1)((ulong)in_stack_ffffffffffffff68 >> 0x38);
  if ((in_ESI == GImGui->NavId) &&
     ((((GImGui->NavDisableHighlight & 1U) == 0 || ((in_EDX & 4) != 0)) &&
      (p_max = GImGui->CurrentWindow, ((p_max->DC).NavHideHighlightOneFrame & 1U) == 0)))) {
    if ((in_EDX & 8) == 0) {
      local_6c = (GImGui->Style).FrameRounding;
    }
    else {
      local_6c = 0.0;
    }
    thickness = (float)((ulong)*in_RDI >> 0x20);
    IVar1 = *(ImVec2 *)(in_RDI + 1);
    p_min = GImGui;
    ImRect::ClipWith(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if ((in_EDX & 1) != 0) {
      local_38 = 0x40000000;
      local_3c = 0x40800000;
      ImVec2::ImVec2(&local_44,4.0,4.0);
      ImRect::Expand((ImRect *)&stack0xffffffffffffffcc,&local_44);
      local_45 = ImRect::Contains(&p_max->ClipRect,(ImRect *)&stack0xffffffffffffffcc);
      if (!(bool)local_45) {
        ImDrawList::PushClipRect
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                   (ImVec2 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (bool)intersect_with_current_clip_rect);
      }
      _x = 1.0;
      ImVec2::ImVec2(&local_58,1.0,1.0);
      local_50 = ::operator+(in_stack_ffffffffffffff48,(ImVec2 *)0x4950e6);
      ImVec2::ImVec2(&local_68,_x,_x);
      local_60 = ::operator-(in_stack_ffffffffffffff48,(ImVec2 *)0x495120);
      GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                  SUB84(in_stack_ffffffffffffff60,0));
      ImDrawList::AddRect((ImDrawList *)CONCAT44(in_ESI,in_EDX),(ImVec2 *)p_min,(ImVec2 *)p_max,
                          (ImU32)local_6c,IVar1.y,(ImDrawFlags)IVar1.x,thickness);
      if ((local_45 & 1) == 0) {
        ImDrawList::PopClipRect(in_stack_ffffffffffffff50);
      }
    }
    if ((in_EDX & 2) != 0) {
      GetColorU32((ImGuiCol)((ulong)&stack0xffffffffffffffd4 >> 0x20),
                  SUB84(&stack0xffffffffffffffd4,0));
      ImDrawList::AddRect((ImDrawList *)CONCAT44(in_ESI,in_EDX),(ImVec2 *)p_min,(ImVec2 *)p_max,
                          (ImU32)local_6c,IVar1.y,(ImDrawFlags)IVar1.x,thickness);
    }
  }
  return;
}

Assistant:

void ImGui::RenderNavHighlight(const ImRect& bb, ImGuiID id, ImGuiNavHighlightFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (id != g.NavId)
        return;
    if (g.NavDisableHighlight && !(flags & ImGuiNavHighlightFlags_AlwaysDraw))
        return;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->DC.NavHideHighlightOneFrame)
        return;

    float rounding = (flags & ImGuiNavHighlightFlags_NoRounding) ? 0.0f : g.Style.FrameRounding;
    ImRect display_rect = bb;
    display_rect.ClipWith(window->ClipRect);
    if (flags & ImGuiNavHighlightFlags_TypeDefault)
    {
        const float THICKNESS = 2.0f;
        const float DISTANCE = 3.0f + THICKNESS * 0.5f;
        display_rect.Expand(ImVec2(DISTANCE, DISTANCE));
        bool fully_visible = window->ClipRect.Contains(display_rect);
        if (!fully_visible)
            window->DrawList->PushClipRect(display_rect.Min, display_rect.Max);
        window->DrawList->AddRect(display_rect.Min + ImVec2(THICKNESS * 0.5f, THICKNESS * 0.5f), display_rect.Max - ImVec2(THICKNESS * 0.5f, THICKNESS * 0.5f), GetColorU32(ImGuiCol_NavHighlight), rounding, 0, THICKNESS);
        if (!fully_visible)
            window->DrawList->PopClipRect();
    }
    if (flags & ImGuiNavHighlightFlags_TypeThin)
    {
        window->DrawList->AddRect(display_rect.Min, display_rect.Max, GetColorU32(ImGuiCol_NavHighlight), rounding, 0, 1.0f);
    }
}